

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

list<int,_ft::allocator<int>_> * __thiscall
ft::list<int,_ft::allocator<int>_>::operator=
          (list<int,_ft::allocator<int>_> *this,list<int,_ft::allocator<int>_> *rhs)

{
  undefined1 local_50 [16];
  list<int,_ft::allocator<int>_> local_40;
  undefined1 local_1a [2];
  list<int,_ft::allocator<int>_> *local_18;
  list<int,_ft::allocator<int>_> *rhs_local;
  list<int,_ft::allocator<int>_> *this_local;
  
  if (rhs != this) {
    local_18 = rhs;
    rhs_local = this;
    get_allocator((list<int,_ft::allocator<int>_> *)local_1a);
    allocator<ft::listNode<int>_>::allocator<int>
              ((allocator<ft::listNode<int>_> *)(local_1a + 1),(allocator<int> *)local_1a);
    allocator<ft::listNode<int>_>::operator=
              ((allocator<ft::listNode<int>_> *)&this->field_0x18,
               (allocator<ft::listNode<int>_> *)(local_1a + 1));
    allocator<ft::listNode<int>_>::~allocator((allocator<ft::listNode<int>_> *)(local_1a + 1));
    allocator<int>::~allocator((allocator<int> *)local_1a);
    begin((list<int,_ft::allocator<int>_> *)(local_50 + 0x10));
    end((list<int,_ft::allocator<int>_> *)local_50);
    list<int,ft::allocator<int>>::assign<ft::constListIterator<int>>
              ((list<int,ft::allocator<int>> *)this,(constListIterator<int> *)(local_50 + 0x10),
               (constListIterator<int> *)local_50,(type *)0x0);
    constListIterator<int>::~constListIterator((constListIterator<int> *)local_50);
    constListIterator<int>::~constListIterator((constListIterator<int> *)(local_50 + 0x10));
  }
  return this;
}

Assistant:

list&	operator=(list const & rhs) {
		if (&rhs != this) {
			this->m_alloc = rhs.get_allocator();
			this->assign(rhs.begin(), rhs.end());
		}
		return *this;
	}